

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# test_context.c
# Opt level: O0

void hexdump(void *ptr,size_t len)

{
  ulong in_RSI;
  char *pcVar1;
  long in_RDI;
  size_t j;
  size_t i;
  uchar *p;
  ulong local_28;
  ulong local_20;
  
  for (local_20 = 0; local_20 < in_RSI; local_20 = local_28 + local_20) {
    for (local_28 = 0; local_28 < 0x10 && local_20 + local_28 < in_RSI; local_28 = local_28 + 1) {
      pcVar1 = " ";
      if (local_28 != 0) {
        pcVar1 = "";
      }
      printf("%s%02x",pcVar1,(ulong)*(byte *)(in_RDI + local_20 + local_28));
    }
  }
  printf("\n");
  return;
}

Assistant:

static void hexdump(const void *ptr, size_t len)
{
    const unsigned char *p = ptr;
    size_t i, j;

    for (i = 0; i < len; i += j) {
	for (j = 0; j < 16 && i + j < len; j++)
	    printf("%s%02x", j? "" : " ", p[i + j]);
    }
    printf("\n");
}